

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O1

void __thiscall Hair_SamplingWeights_Test::TestBody(Hair_SamplingWeights_Test *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  byte bVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  uint64_t oldstate;
  ulong uVar15;
  undefined1 *puVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  float fVar19;
  Float FVar20;
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined4 in_XMM6_Da;
  undefined4 in_XMM6_Db;
  undefined8 in_XMM6_Qb;
  Vector3f wo;
  Float avg;
  Float invBase_2;
  Float invBase_1;
  Float invBase;
  Float invBase_3;
  SampledWavelengths lambda_1;
  optional<pbrt::BSDFSample> bs;
  SampledWavelengths lambda;
  HairBxDF hair;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  ulong local_160;
  float local_158;
  float local_154;
  AssertHelper local_150;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  undefined1 local_128 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120 [3];
  ulong local_108;
  ulong local_100;
  undefined1 *local_f8;
  ulong local_f0;
  optional<pbrt::BSDFSample> local_e8;
  SampledSpectrum local_b8;
  SampledWavelengths local_a0;
  HairBxDF local_80;
  
  pbrt::SampledWavelengths::SampleXYZ(&local_a0,0.5);
  uVar15 = 2;
  local_138 = 0.5;
  uVar9 = 3;
  local_13c = 0.33333334;
  local_f0 = 5;
  local_140 = 0.2;
  local_144 = 0.14285715;
  local_130 = 0.09090909;
  local_134 = 0.07692308;
  local_170 = 0.1;
  local_f8 = &DAT_5851f42d4c957f2e;
  local_108 = uVar9;
  local_100 = uVar15;
  do {
    local_16c = 0.4;
    do {
      uVar14 = 0;
      do {
        auVar18 = ZEXT816(0) << 0x40;
        if (uVar14 != 0) {
          fVar19 = 1.0;
          lVar11 = 0;
          uVar13 = uVar14;
          do {
            lVar11 = (lVar11 - uVar13 / uVar15) * uVar15 + uVar13;
            fVar19 = local_138 * fVar19;
            bVar17 = uVar15 <= uVar13;
            uVar13 = uVar13 / uVar15;
          } while (bVar17);
          auVar18._4_4_ = in_XMM6_Db;
          auVar18._0_4_ = in_XMM6_Da;
          auVar18._8_8_ = in_XMM6_Qb;
          auVar18 = vcvtusi2ss_avx512f(auVar18,lVar11);
          auVar18 = ZEXT416((uint)(fVar19 * auVar18._0_4_));
        }
        local_b8.values.values[0] = 0.0;
        local_b8.values.values[1] = 0.0;
        local_b8.values.values[2] = 0.0;
        local_b8.values.values[3] = 0.0;
        auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar18);
        auVar21._0_8_ = (double)auVar18._0_4_;
        auVar21._8_8_ = auVar18._8_8_;
        auVar21 = vfmadd132sd_fma(auVar21,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
        auVar18 = vminsd_avx(ZEXT816(0x3feffffde7210be9),auVar21);
        uVar2 = vcmpsd_avx512f(auVar21,ZEXT816(0xbfeffffde7210be9),1);
        bVar17 = (bool)((byte)uVar2 & 1);
        local_160 = uVar14;
        pbrt::HairBxDF::HairBxDF
                  (&local_80,
                   (float)(double)((ulong)bVar17 * -0x4010000218def417 +
                                  (ulong)!bVar17 * auVar18._0_8_),1.55,&local_b8,local_170,local_16c
                   ,0.0);
        auVar18 = ZEXT816(0) << 0x40;
        if (uVar14 != 0) {
          fVar19 = 1.0;
          lVar11 = 0;
          do {
            lVar11 = (lVar11 - uVar14 / uVar9) * uVar9 + uVar14;
            fVar19 = local_13c * fVar19;
            bVar17 = uVar9 <= uVar14;
            uVar14 = uVar14 / uVar9;
          } while (bVar17);
          auVar23._4_4_ = in_XMM6_Db;
          auVar23._0_4_ = in_XMM6_Da;
          auVar23._8_8_ = in_XMM6_Qb;
          auVar18 = vcvtusi2ss_avx512f(auVar23,lVar11);
          auVar18 = ZEXT416((uint)(fVar19 * auVar18._0_4_));
          uVar14 = local_160;
        }
        if (uVar14 == 0) {
          auVar21 = ZEXT816(0) << 0x40;
        }
        else {
          fVar19 = 1.0;
          lVar11 = 0;
          do {
            lVar11 = (lVar11 - uVar14 / local_f0) * local_f0 + uVar14;
            fVar19 = local_140 * fVar19;
            bVar17 = local_f0 <= uVar14;
            uVar14 = uVar14 / local_f0;
          } while (bVar17);
          auVar1._4_4_ = in_XMM6_Db;
          auVar1._0_4_ = in_XMM6_Da;
          auVar1._8_8_ = in_XMM6_Qb;
          auVar21 = vcvtusi2ss_avx512f(auVar1,lVar11);
          auVar21 = ZEXT416((uint)(fVar19 * auVar21._0_4_));
        }
        auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar18);
        auVar23 = vfmadd132ss_fma(auVar18,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
        auVar18 = vfnmadd213ss_fma(auVar23,auVar23,SUB6416(ZEXT464(0x3f800000),0));
        auVar18 = vmaxss_avx(auVar18,ZEXT816(0));
        local_164 = auVar23._0_4_;
        if (auVar18._0_4_ < 0.0) {
          local_168 = auVar21._0_4_;
          local_158 = sqrtf(auVar18._0_4_);
          auVar21 = ZEXT416((uint)local_168);
        }
        else {
          auVar18 = vsqrtss_avx(auVar18,auVar18);
          local_158 = auVar18._0_4_;
        }
        auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar21);
        local_12c = auVar18._0_4_ * 6.2831855;
        local_168 = cosf(local_12c);
        fVar19 = sinf(local_12c);
        auVar18 = ZEXT816(0) << 0x40;
        auVar21 = ZEXT816(0) << 0x40;
        if (local_160 != 0) {
          fVar22 = 1.0;
          lVar11 = 0;
          uVar14 = local_160;
          do {
            lVar11 = (lVar11 - uVar14 / 7) * 7 + uVar14;
            fVar22 = local_144 * fVar22;
            bVar17 = 6 < uVar14;
            uVar14 = uVar14 / 7;
          } while (bVar17);
          auVar24._4_4_ = in_XMM6_Db;
          auVar24._0_4_ = in_XMM6_Da;
          auVar24._8_8_ = in_XMM6_Qb;
          auVar21 = vcvtusi2ss_avx512f(auVar24,lVar11);
          auVar21 = ZEXT416((uint)(fVar22 * auVar21._0_4_));
        }
        if (local_160 != 0) {
          fVar22 = 1.0;
          lVar11 = 0;
          uVar14 = local_160;
          do {
            lVar11 = (lVar11 - uVar14 / 0xb) * 0xb + uVar14;
            fVar22 = local_130 * fVar22;
            bVar17 = 10 < uVar14;
            uVar14 = uVar14 / 0xb;
          } while (bVar17);
          auVar4._4_4_ = in_XMM6_Db;
          auVar4._0_4_ = in_XMM6_Da;
          auVar4._8_8_ = in_XMM6_Qb;
          auVar18 = vcvtusi2ss_avx512f(auVar4,lVar11);
          auVar18 = ZEXT416((uint)(fVar22 * auVar18._0_4_));
        }
        if (local_160 == 0) {
          auVar23 = ZEXT816(0) << 0x40;
        }
        else {
          fVar22 = 1.0;
          lVar11 = 0;
          uVar14 = local_160;
          do {
            lVar11 = (lVar11 - uVar14 / 0xd) * 0xd + uVar14;
            fVar22 = local_134 * fVar22;
            bVar17 = 0xc < uVar14;
            uVar14 = uVar14 / 0xd;
          } while (bVar17);
          auVar5._4_4_ = in_XMM6_Db;
          auVar5._0_4_ = in_XMM6_Da;
          auVar5._8_8_ = in_XMM6_Qb;
          auVar23 = vcvtusi2ss_avx512f(auVar5,lVar11);
          auVar23 = ZEXT416((uint)(fVar22 * auVar23._0_4_));
        }
        auVar1 = vinsertps_avx(ZEXT416((uint)(local_158 * local_168)),
                               ZEXT416((uint)(local_158 * fVar19)),0x10);
        auVar24 = SUB6416(ZEXT464(0x3f7fffff),0);
        auVar21 = vminss_avx(auVar24,auVar21);
        auVar18 = vminss_avx(auVar24,auVar18);
        auVar23 = vminss_avx(auVar24,auVar23);
        auVar18 = vinsertps_avx(auVar18,auVar23,0x10);
        wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar1._0_8_;
        wo.super_Tuple3<pbrt::Vector3,_float>.z = local_164;
        pbrt::HairBxDF::Sample_f
                  (&local_e8,&local_80,wo,auVar21._0_4_,(Point2f)auVar18._0_8_,Radiance,All);
        if (local_e8.set == true) {
          iVar10 = 0;
          fVar19 = 0.0;
          puVar16 = local_f8;
          do {
            uVar7 = (uint)((ulong)puVar16 >> 0x2d) ^ (uint)((ulong)puVar16 >> 0x1b);
            bVar8 = (byte)((ulong)puVar16 >> 0x3b);
            auVar6._4_4_ = in_XMM6_Db;
            auVar6._0_4_ = in_XMM6_Da;
            auVar6._8_8_ = in_XMM6_Qb;
            auVar18 = vcvtusi2ss_avx512f(auVar6,uVar7 >> bVar8 | uVar7 << 0x20 - bVar8);
            auVar18 = vminss_avx(ZEXT416((uint)(auVar18._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff))
            ;
            local_164 = fVar19;
            pbrt::SampledWavelengths::SampleXYZ
                      ((SampledWavelengths *)local_128,(auVar18._0_4_ + (float)iVar10) / 20.0);
            if (local_e8.set == false) {
LAB_00247e52:
              pbrt::LogFatal<char_const(&)[4]>
                        (Fatal,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                         ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
            }
            FVar20 = pbrt::SampledSpectrum::y
                               ((SampledSpectrum *)&local_e8,(SampledWavelengths *)local_128);
            if (local_e8.set != true) goto LAB_00247e52;
            puVar16 = (undefined1 *)((long)puVar16 * 0x5851f42d4c957f2d + 1);
            auVar3._8_4_ = 0x7fffffff;
            auVar3._0_8_ = 0x7fffffff7fffffff;
            auVar3._12_4_ = 0x7fffffff;
            auVar18 = vandps_avx512vl(ZEXT416((uint)local_e8.optionalValue._24_4_),auVar3);
            fVar19 = local_164 + (FVar20 * auVar18._0_4_) / (float)local_e8.optionalValue._28_4_;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0x14);
          local_154 = fVar19 / 20.0;
          local_178.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DAT_3fefae147ae147ae;
          testing::internal::CmpHelperGT<float,double>
                    ((internal *)local_128,"avg","0.99",&local_154,(double *)&local_178);
          uVar15 = local_100;
          uVar9 = local_108;
          if (local_128[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_178);
            pcVar12 = "";
            if (local_120[0].ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar12 = ((local_120[0].ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                       ,0x2f2,pcVar12);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            if (local_178.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar17 = testing::internal::IsTrue(true);
              if ((bVar17) &&
                 (local_178.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_178.ptr_ + 8))();
              }
              local_178.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          local_178.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &DAT_3ff028f5c28f5c29;
          testing::internal::CmpHelperLT<float,double>
                    ((internal *)local_128,"avg","1.01",&local_154,(double *)&local_178);
          if (local_128[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_178);
            pcVar12 = "";
            if (local_120[0].ptr_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar12 = ((local_120[0].ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_150,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bsdfs_test.cpp"
                       ,0x2f3,pcVar12);
            testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_178);
            testing::internal::AssertHelper::~AssertHelper(&local_150);
            if (local_178.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar17 = testing::internal::IsTrue(true);
              if ((bVar17) &&
                 (local_178.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_178.ptr_ + 8))();
              }
              local_178.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(local_120,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
        }
        if (local_e8.set == true) {
          local_e8.set = false;
        }
        uVar14 = local_160 + 1;
      } while (uVar14 != 10000);
      local_16c = local_16c + 0.2;
    } while (local_16c < 1.0);
    local_170 = local_170 + 0.2;
    if (1.0 <= local_170) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Hair, SamplingWeights) {
    RNG rng;
    SampledWavelengths lambda = SampledWavelengths::SampleXYZ(0.5);
    for (Float beta_m = .1; beta_m < 1; beta_m += .2)
        for (Float beta_n = .4; beta_n < 1; beta_n += .2) {
            int count = 10000;
            for (int i = 0; i < count; ++i) {
                Float h = Clamp(-1 + 2. * RadicalInverse(0, i), -.999999, .999999);

                // Check _HairBxDF::Sample\_f()_ sample weight
                SampledSpectrum sigma_a(0.);
                HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);

                Vector3f wo =
                    SampleUniformSphere({RadicalInverse(1, i), RadicalInverse(2, i)});
                Float uc = RadicalInverse(3, i);
                Point2f u = {RadicalInverse(4, i), RadicalInverse(5, i)};
                pstd::optional<BSDFSample> bs = hair.Sample_f(wo, uc, u, TransportMode::Radiance,
                                                              BxDFReflTransFlags::All);
                if (bs) {
                    Float sum = 0;
                    int ny = 20;
                    for (Float u : Stratified1D(ny)) {
                        SampledWavelengths lambda = SampledWavelengths::SampleXYZ(u);
                        sum += bs->f.y(lambda) * AbsCosTheta(bs->wi) / bs->pdf;
                    }

                    // Verify that hair BSDF sample weight is close to 1 for
                    // _wi_
                    Float avg = sum / ny;
                    EXPECT_GT(avg, 0.99);
                    EXPECT_LT(avg, 1.01);
                }
            }
        }
}